

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

void __thiscall
duckdb::CardinalityEstimator::AddRelationTdom(CardinalityEstimator *this,FilterInfo *filter_info)

{
  pointer pRVar1;
  const_iterator cVar2;
  vector<duckdb::RelationsToTDom,_true> *__range1;
  RelationsToTDom *r2tdom;
  pointer this_00;
  RelationsToTDom new_r2tdom;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [8];
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_e0;
  undefined1 local_a8 [128];
  
  this_00 = (this->relations_to_tdoms).
            super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
            super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pRVar1) {
    do {
      cVar2 = ::std::
              _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)this_00,&filter_info->left_binding);
      if (cVar2.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur != (__node_type *)0x0)
      {
        return;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pRVar1);
  }
  local_f8 = (undefined4)(filter_info->left_binding).table_index;
  uStack_f4 = *(undefined4 *)((long)&(filter_info->left_binding).table_index + 4);
  uStack_f0 = (undefined4)(filter_info->left_binding).column_index;
  uStack_ec = *(undefined4 *)((long)&(filter_info->left_binding).column_index + 4);
  ::std::
  _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<duckdb::ColumnBinding_const*>
            ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_e0,&local_f8,local_e8,0,&local_f9,&local_fa,&local_fb);
  RelationsToTDom::RelationsToTDom((RelationsToTDom *)local_a8,(column_binding_set_t *)&local_e0);
  ::std::
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_e0);
  ::std::vector<duckdb::RelationsToTDom,std::allocator<duckdb::RelationsToTDom>>::
  emplace_back<duckdb::RelationsToTDom&>
            ((vector<duckdb::RelationsToTDom,std::allocator<duckdb::RelationsToTDom>> *)this,
             (RelationsToTDom *)local_a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a8 + 0x68));
  if ((pointer)local_a8._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._80_8_);
  }
  ::std::
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_a8);
  return;
}

Assistant:

void CardinalityEstimator::AddRelationTdom(FilterInfo &filter_info) {
	D_ASSERT(filter_info.set.get().count >= 1);
	for (const RelationsToTDom &r2tdom : relations_to_tdoms) {
		auto &i_set = r2tdom.equivalent_relations;
		if (i_set.find(filter_info.left_binding) != i_set.end()) {
			// found an equivalent filter
			return;
		}
	}

	auto key = ColumnBinding(filter_info.left_binding.table_index, filter_info.left_binding.column_index);
	RelationsToTDom new_r2tdom(column_binding_set_t({key}));

	relations_to_tdoms.emplace_back(new_r2tdom);
}